

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.hpp
# Opt level: O2

void __thiscall crawler::Node::Node(Node *this,string *str,shared_ptr<crawler::Node> *_parent)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->nodeType = Text;
  std::__detail::__variant::_Variant_storage<false,crawler::ElementData,std::__cxx11::string>::
  _Variant_storage<1ul,std::__cxx11::string_const&>
            ((_Variant_storage<false,crawler::ElementData,std::__cxx11::string> *)&this->nodeData);
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

explicit Node(const std::string &str, std::shared_ptr<Node> _parent)
      : nodeType(NodeType::Text), nodeData(str), parent(std::move(_parent)) {}